

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBufferTest.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  time_t tVar1;
  CircBufTest *this;
  int local_6c;
  int i;
  TestCase *test_set [9];
  TestRunner runner;
  char **argv_local;
  int argc_local;
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  TestRunner::TestRunner((TestRunner *)((long)test_set + 0x47),*argv);
  for (local_6c = 0; local_6c < 9; local_6c = local_6c + 1) {
    this = (CircBufTest *)
           operator_new(0x288,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                        ,0x420);
    CircBufTest::CircBufTest(this,local_6c);
    *(CircBufTest **)(&stack0xffffffffffffff98 + (long)local_6c * 8) = this;
  }
  TestRunner::RunAll((TestRunner *)((long)test_set + 0x47),(TestCase **)&stack0xffffffffffffff98,9);
  return 0;
}

Assistant:

int main( int argc, char *argv[] )
{
	srand(time(NULL));

	TestRunner runner( argv[ 0 ] );

	TestCase *test_set[ gNumberTests ];

	for ( int i = 0; i < gNumberTests; i++ )
		test_set[ i ] = jh_new CircBufTest( i );

	runner.RunAll( test_set, gNumberTests );

	return 0;


}